

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O1

int tokthfind(toktdef *tab1,int typ,uint val,toksdef *ret)

{
  int iVar1;
  uint hash;
  tokseadef ctx;
  undefined1 auStack_68 [8];
  undefined1 local_60;
  undefined2 local_5e;
  toksdef *local_30;
  
  local_60 = (undefined1)typ;
  local_5e = (undefined2)val;
  hash = 0;
  local_30 = ret;
  do {
    iVar1 = tokthscan((tokthdef *)tab1,hash,tokthfind1,auStack_68);
    if (iVar1 != 0) {
      return 1;
    }
    hash = hash + 1;
  } while (hash != 0x100);
  return 0;
}

Assistant:

int tokthfind(toktdef *tab1, int typ, uint val, toksdef *ret)
{
    tokseadef ctx;
    int       i;
    
    ctx.tokseasym.tokstyp = typ;
    ctx.tokseasym.toksval = val;
    ctx.toksearet = ret;
    
    for (i = 0 ; i < TOKHASHSIZE ; ++i)
    {
        if (tokthscan((tokthdef *)tab1, i, tokthfind1, &ctx))
            return(TRUE);
    }
    return(FALSE);
}